

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

string * google::PrintStringFlagsWithQuotes
                   (string *__return_storage_ptr__,CommandLineFlagInfo *flag,string *text,
                   bool current)

{
  pointer pcVar1;
  int iVar2;
  char *format;
  
  pcVar1 = (&flag->current_value)[!current]._M_dataplus._M_p;
  iVar2 = strcmp((flag->type)._M_dataplus._M_p,"string");
  format = "%s: %s";
  if (iVar2 == 0) {
    format = "%s: \"%s\"";
  }
  StringPrintf_abi_cxx11_(__return_storage_ptr__,format,(text->_M_dataplus)._M_p,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static string PrintStringFlagsWithQuotes(const CommandLineFlagInfo& flag,
                                         const string& text, bool current) {
  const char* c_string = (current ? flag.current_value.c_str() :
                          flag.default_value.c_str());
  if (strcmp(flag.type.c_str(), "string") == 0) {  // add quotes for strings
    return StringPrintf("%s: \"%s\"", text.c_str(), c_string);
  } else {
    return StringPrintf("%s: %s", text.c_str(), c_string);
  }
}